

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_internal.h
# Opt level: O0

int mbedtls_ssl_safer_memcmp(void *a,void *b,size_t n)

{
  byte local_39;
  uchar diff;
  uchar *B;
  uchar *A;
  size_t i;
  size_t n_local;
  void *b_local;
  void *a_local;
  
  local_39 = 0;
  for (A = (uchar *)0x0; A < n; A = A + 1) {
    local_39 = local_39 | *(byte *)((long)a + (long)A) ^ *(byte *)((long)b + (long)A);
  }
  return (int)local_39;
}

Assistant:

static inline int mbedtls_ssl_safer_memcmp( const void *a, const void *b, size_t n )
{
    size_t i;
    const unsigned char *A = (const unsigned char *) a;
    const unsigned char *B = (const unsigned char *) b;
    unsigned char diff = 0;

    for( i = 0; i < n; i++ )
        diff |= A[i] ^ B[i];

    return( diff );
}